

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  undefined4 local_14;
  int rc;
  Pager *pPager_local;
  
  local_14 = 0;
  iVar1 = pagerUseWal(pPager);
  if (iVar1 == 0) {
    local_14 = pager_wait_on_lock(pPager,4);
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerExclusiveLock(Pager *pPager){
  int rc = SQLITE_OK;
  assert( pPager->eState==PAGER_WRITER_CACHEMOD 
       || pPager->eState==PAGER_WRITER_DBMOD 
       || pPager->eState==PAGER_WRITER_LOCKED 
  );
  assert( assert_pager_state(pPager) );
  if( 0==pagerUseWal(pPager) ){
    rc = pager_wait_on_lock(pPager, EXCLUSIVE_LOCK);
  }
  return rc;
}